

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeHandleMovedCursor(VdbeCursor *p)

{
  long lVar1;
  int iVar2;
  BtCursor *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int isDifferentRow;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3BtreeCursorRestore(in_RDI,(int *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe0));
  *(undefined4 *)&in_RDI->pKey = 0;
  in_RDI->curPagerFlags = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeHandleMovedCursor(VdbeCursor *p){
  int isDifferentRow, rc;
  assert( p->eCurType==CURTYPE_BTREE );
  assert( p->uc.pCursor!=0 );
  assert( sqlite3BtreeCursorHasMoved(p->uc.pCursor) );
  rc = sqlite3BtreeCursorRestore(p->uc.pCursor, &isDifferentRow);
  p->cacheStatus = CACHE_STALE;
  if( isDifferentRow ) p->nullRow = 1;
  return rc;
}